

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O1

void __thiscall
bssl::HPKETest_SetupSenderBufferTooSmall_Test::TestBody
          (HPKETest_SetupSenderBufferTooSmall_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  ulong uVar2;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  size_t enc_len;
  uint8_t enc [31];
  uint8_t public_key_r [32];
  uint8_t secret_key_r [32];
  ScopedEVP_HPKE_CTX sender_ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_390;
  AssertHelper local_388;
  internal local_380 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  string local_370;
  size_t local_350;
  uint8_t local_348 [32];
  uint8_t local_328 [32];
  uint8_t local_308 [40];
  EVP_HPKE_CTX local_2e0;
  
  X25519_keypair(local_328,local_308);
  EVP_HPKE_CTX_zero(&local_2e0);
  kem = EVP_hpke_x25519_hkdf_sha256();
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  iVar1 = EVP_HPKE_CTX_setup_sender
                    (&local_2e0,local_348,&local_350,0x1f,kem,kdf,aead,local_328,0x20,(uint8_t *)0x0
                     ,0);
  local_380[0] = (internal)(iVar1 == 0);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_380[0]) {
    uVar2 = ERR_get_error();
    ErrorEquals((uint32_t)local_380,(int)uVar2,6);
    if (local_380[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_390);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_370,local_380,
                 (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_EVP, 137)","false","true",
                 (char *)kdf);
      testing::internal::AssertHelper::AssertHelper
                (&local_388,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x24b,local_370._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_390);
      testing::internal::AssertHelper::~AssertHelper(&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if (local_390._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_390._M_head_impl + 8))();
      }
    }
    if (local_378 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_378,local_378);
    }
    ERR_clear_error();
  }
  else {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,local_380,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0)"
               ,"true","false",(char *)kdf);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x249,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_390._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_390._M_head_impl + 8))();
    }
    if (local_378 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_378,local_378);
    }
  }
  EVP_HPKE_CTX_cleanup(&local_2e0);
  return;
}

Assistant:

TEST(HPKETest, SetupSenderBufferTooSmall) {
  uint8_t secret_key_r[X25519_PRIVATE_KEY_LEN];
  uint8_t public_key_r[X25519_PUBLIC_VALUE_LEN];
  X25519_keypair(public_key_r, secret_key_r);

  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t enc[X25519_PUBLIC_VALUE_LEN - 1];
  size_t enc_len;
  ASSERT_FALSE(EVP_HPKE_CTX_setup_sender(
      sender_ctx.get(), enc, &enc_len, sizeof(enc),
      EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_EVP, EVP_R_INVALID_BUFFER_SIZE));
  ERR_clear_error();
}